

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void delta_encode_palette_colors(int *colors,int num,int bit_depth,int min_val,aom_writer *w)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i_1;
  int range;
  int bits;
  int min_bits;
  int delta;
  int i;
  int deltas [8];
  int max_delta;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_64;
  int local_60;
  int local_58;
  int local_4c;
  int local_48 [9];
  int local_24;
  int local_10;
  int local_c;
  long local_8;
  
  if ((0 < in_ESI) &&
     (local_10 = in_EDX, local_c = in_ESI, local_8 = in_RDI,
     aom_write_literal((aom_writer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88), local_c != 1)) {
    local_24 = 0;
    memset(local_48,0,0x20);
    for (local_4c = 1; local_4c < local_c; local_4c = local_4c + 1) {
      iVar1 = *(int *)(local_8 + (long)local_4c * 4) - *(int *)(local_8 + (long)(local_4c + -1) * 4)
      ;
      local_48[local_4c + -1] = iVar1;
      if (local_24 < iVar1) {
        local_24 = iVar1;
      }
    }
    local_64 = local_10 + -3;
    iVar1 = av1_ceil_log2(0x513242);
    if (local_64 < iVar1) {
      local_64 = av1_ceil_log2(0x513258);
    }
    local_58 = local_64;
    aom_write_literal((aom_writer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    for (local_60 = 0; local_60 < local_c + -1; local_60 = local_60 + 1) {
      aom_write_literal((aom_writer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      iVar1 = av1_ceil_log2(0x5132f5);
      if (iVar1 <= local_58) {
        local_58 = av1_ceil_log2(0x513312);
      }
      in_stack_ffffffffffffff94 = local_58;
    }
  }
  return;
}

Assistant:

static inline void delta_encode_palette_colors(const int *colors, int num,
                                               int bit_depth, int min_val,
                                               aom_writer *w) {
  if (num <= 0) return;
  assert(colors[0] < (1 << bit_depth));
  aom_write_literal(w, colors[0], bit_depth);
  if (num == 1) return;
  int max_delta = 0;
  int deltas[PALETTE_MAX_SIZE];
  memset(deltas, 0, sizeof(deltas));
  for (int i = 1; i < num; ++i) {
    assert(colors[i] < (1 << bit_depth));
    const int delta = colors[i] - colors[i - 1];
    deltas[i - 1] = delta;
    assert(delta >= min_val);
    if (delta > max_delta) max_delta = delta;
  }
  const int min_bits = bit_depth - 3;
  int bits = AOMMAX(av1_ceil_log2(max_delta + 1 - min_val), min_bits);
  assert(bits <= bit_depth);
  int range = (1 << bit_depth) - colors[0] - min_val;
  aom_write_literal(w, bits - min_bits, 2);
  for (int i = 0; i < num - 1; ++i) {
    aom_write_literal(w, deltas[i] - min_val, bits);
    range -= deltas[i];
    bits = AOMMIN(bits, av1_ceil_log2(range));
  }
}